

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unreachable.cc
# Opt level: O2

void __thiscall re2c::Skeleton::warn_unreachable_rules(Skeleton *this)

{
  rules_t *this_00;
  Node *pNVar1;
  rules_t *prVar2;
  bool bVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  ulong uVar7;
  string *cond;
  rule_rank_t r;
  rule_rank_t r2;
  rule_rank_t r1;
  rule_rank_t local_44;
  rule_rank_t local_40;
  rule_rank_t local_3c;
  Skeleton *local_38;
  
  Node::calc_reachable(this->nodes);
  this_00 = &this->rules;
  uVar6 = 0;
  local_38 = this;
  do {
    uVar7 = (ulong)uVar6;
    if (local_38->nodes_count <= uVar7) {
      prVar2 = &local_38->rules;
      cond = &local_38->cond;
      for (p_Var5 = (local_38->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(prVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        local_44.value = p_Var5[1]._M_color;
        bVar3 = rule_rank_t::is_none(&local_44);
        if (!bVar3) {
          bVar3 = rule_rank_t::is_def(&local_44);
          if (!bVar3) {
            pmVar4 = std::
                     map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                     ::operator[](this_00,&local_44);
            if (pmVar4->reachable == false) {
              Warn::unreachable_rule((Warn *)warn,cond,(rule_info_t *)&p_Var5[1]._M_parent,this_00);
            }
          }
        }
      }
      return;
    }
    pNVar1 = local_38->nodes;
    local_3c.value = pNVar1[uVar7].rule.rank.value;
    for (p_Var5 = pNVar1[uVar7].reachable._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &pNVar1[uVar7].reachable._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      local_40.value = p_Var5[1]._M_color;
      bVar3 = rule_rank_t::operator==(&local_3c,&local_40);
      if (bVar3) {
LAB_0014223e:
        pmVar4 = std::
                 map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                 ::operator[](this_00,&local_3c);
        pmVar4->reachable = true;
      }
      else {
        bVar3 = rule_rank_t::is_none(&local_40);
        if (bVar3) goto LAB_0014223e;
        pmVar4 = std::
                 map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                 ::operator[](this_00,&local_3c);
        std::
        _Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
        ::_M_insert_unique<re2c::rule_rank_t_const&>
                  ((_Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
                    *)&pmVar4->shadow,&local_40);
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Skeleton::warn_unreachable_rules ()
{
	nodes->calc_reachable ();
	for (uint32_t i = 0; i < nodes_count; ++i)
	{
		const rule_rank_t r1 = nodes[i].rule.rank;
		const std::set<rule_t> & rs = nodes[i].reachable;
		for (std::set<rule_t>::const_iterator j = rs.begin (); j != rs.end (); ++j)
		{
			const rule_rank_t r2 = j->rank;
			if (r1 == r2 || r2.is_none ())
			{
				rules[r1].reachable = true;
			}
			else
			{
				rules[r1].shadow.insert (r2);
			}
		}
	}

	// warn about unreachable rules:
	//   - rules that are shadowed by other rules, e.g. rule '[a]' is shadowed by '[a] [^]'
	//   - infinite rules that consume infinitely many characters and fail on YYFILL, e.g. '[^]*'
	//   - rules that contain never-matching link, e.g. '[]' with option '--empty-class match-none'
	// default rule '*' should not be reported
	for (rules_t::const_iterator i = rules.begin (); i != rules.end (); ++i)
	{
		const rule_rank_t r = i->first;
		if (!r.is_none () && !r.is_def () && !rules[r].reachable)
		{
			warn.unreachable_rule (cond, i->second, rules);
		}
	}
}